

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O2

void helics::apps::TypedBrokerServer::assignPort
               (portData *pd,int pnumber,shared_ptr<helics::Broker> *brk)

{
  __shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *this;
  
  this = (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)
         (pd->
         super__Vector_base<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (this == (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)
                (pd->
                super__Vector_base<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (*(int *)((long)&this[1]._M_ptr + 4) == pnumber) break;
    this = (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&this[1]._M_refcount;
  }
  *(undefined1 *)&this[1]._M_ptr = 1;
  std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this,(__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)brk);
  return;
}

Assistant:

void TypedBrokerServer::assignPort(portData& pd, int pnumber, std::shared_ptr<Broker>& brk)
{
    for (auto& pdi : pd) {
        if (std::get<0>(pdi) == pnumber) {
            std::get<1>(pdi) = true;
            std::get<2>(pdi) = brk;
            break;
        }
    }
}